

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnAtomicFenceExpr
          (ExprVisitorDelegate *this,AtomicFenceExpr *expr)

{
  WatWriter *this_00;
  Info local_58;
  
  if (expr->consistency_model == 0) {
    this_00 = this->writer_;
    Opcode::GetInfo(&local_58,(Opcode *)&Opcode::AtomicFence_Opcode);
    WritePuts(this_00,local_58.name,Newline);
    return (Result)Ok;
  }
  __assert_fail("expr->consistency_model == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wat-writer.cc"
                ,0x423,
                "virtual Result wabt::(anonymous namespace)::WatWriter::ExprVisitorDelegate::OnAtomicFenceExpr(AtomicFenceExpr *)"
               );
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnAtomicFenceExpr(
    AtomicFenceExpr* expr) {
  assert(expr->consistency_model == 0);
  writer_->WritePutsNewline(Opcode::AtomicFence_Opcode.GetName());
  return Result::Ok;
}